

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

bool __thiscall
glslang::TParseContext::lValueErrorCheck
          (TParseContext *this,TSourceLoc *loc,char *op,TIntermTyped *node)

{
  int iVar1;
  TIntermediate *pTVar2;
  ulong uVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  long *plVar10;
  long lVar11;
  ulong uVar12;
  undefined8 uVar13;
  long *plVar14;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *pcVar15;
  char *pcVar16;
  undefined8 *puVar17;
  bool bVar18;
  int offset [4];
  char *local_60;
  int local_48 [6];
  long *plVar9;
  
  iVar7 = (*(node->super_TIntermNode)._vptr_TIntermNode[8])(node);
  plVar9 = (long *)CONCAT44(extraout_var,iVar7);
  if (plVar9 == (long *)0x0) goto LAB_00428807;
  bVar4 = false;
  uVar8 = (int)plVar9[0x17] - 0x33;
  uVar12 = (ulong)uVar8;
  if (uVar8 < 2) {
    if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangTessControl) {
      plVar10 = (long *)(**(code **)(*plVar9 + 400))(plVar9);
      plVar10 = (long *)(**(code **)(*plVar10 + 0xf0))(plVar10);
      lVar11 = (**(code **)(*plVar10 + 0x58))(plVar10);
      uVar8 = *(uint *)(lVar11 + 8) & 0x7f;
      uVar12 = (ulong)uVar8;
      if ((uVar8 != 4) ||
         (uVar12 = (**(code **)(*plVar10 + 0x58))(plVar10), (*(byte *)(uVar12 + 0xd) & 0x10) != 0))
      goto LAB_004287d3;
      plVar10 = (long *)(**(code **)(*plVar9 + 400))(plVar9);
      uVar12 = (**(code **)(*plVar10 + 0x60))(plVar10);
      if (uVar12 != 0) {
        plVar10 = (long *)(**(code **)(*plVar9 + 0x198))(plVar9);
        plVar10 = (long *)(**(code **)(*plVar10 + 0x60))(plVar10);
        if ((plVar10 != (long *)0x0) &&
           (uVar12 = (**(code **)(*plVar10 + 0x110))(plVar10),
           (*(uint *)(uVar12 + 8) & 0xff80) == 0x1980)) goto LAB_004287d3;
        uVar8 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                          (this,loc,
                           "tessellation-control per-vertex output l-value must be indexed with gl_InvocationID"
                           ,"[]","");
        uVar12 = (ulong)uVar8;
      }
    }
    bVar4 = false;
  }
  else if ((int)plVar9[0x17] == 0x36) {
    uVar13 = (**(code **)(*plVar9 + 400))(plVar9);
    uVar8 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x42])
                      (this,loc,op,uVar13);
    uVar3 = (ulong)uVar8;
    if ((char)uVar8 == '\0') {
      local_48[0] = 0;
      local_48[1] = 0;
      local_48[2] = 0;
      local_48[3] = 0;
      plVar10 = (long *)(**(code **)(*plVar9 + 0x198))(plVar9);
      plVar10 = (long *)(**(code **)(*plVar10 + 0x30))(plVar10);
      lVar11 = (**(code **)(*plVar10 + 400))(plVar10);
      puVar17 = *(undefined8 **)(lVar11 + 8);
      lVar11 = (**(code **)(*plVar10 + 400))(plVar10);
      bVar4 = false;
      for (; bVar18 = puVar17 != *(undefined8 **)(lVar11 + 0x10), bVar18; puVar17 = puVar17 + 1) {
        plVar14 = (long *)(**(code **)(*(long *)*puVar17 + 0x18))();
        lVar11 = (**(code **)(*plVar14 + 0x28))(plVar14);
        iVar7 = **(int **)(*(long *)(lVar11 + 0xc0) + 8);
        iVar1 = local_48[iVar7];
        local_48[iVar7] = iVar1 + 1;
        if (0 < iVar1) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc," l-value of swizzle cannot have duplicate components",op);
          bVar4 = true;
          break;
        }
        lVar11 = (**(code **)(*plVar10 + 400))(plVar10);
      }
      uVar12 = 1;
      uVar3 = 0;
      if (bVar18) goto LAB_004287d3;
    }
    uVar12 = uVar3;
    bVar4 = true;
  }
LAB_004287d3:
  bVar5 = (byte)uVar12;
  if (bVar4) goto LAB_004289c6;
  if ((int)plVar9[0x17] == 0x35) {
    lVar11 = (**(code **)(*plVar9 + 400))(plVar9);
    iVar7 = (**(code **)(*(long *)(lVar11 + 0x20) + 0x38))(lVar11 + 0x20);
    if (iVar7 != 0x12) goto LAB_00428807;
    goto LAB_00428976;
  }
LAB_00428807:
  bVar4 = TParseContextBase::lValueErrorCheck(&this->super_TParseContextBase,loc,op,node);
  bVar5 = 1;
  if (bVar4) goto LAB_004289c6;
  iVar7 = (*(node->super_TIntermNode)._vptr_TIntermNode[0xc])(node);
  plVar10 = (long *)CONCAT44(extraout_var_00,iVar7);
  if (plVar10 == (long *)0x0) {
    local_60 = (char *)0x0;
  }
  else {
    lVar11 = (**(code **)(*plVar10 + 400))(plVar10);
    local_60 = *(char **)(lVar11 + 8);
  }
  iVar7 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x21])(node);
  uVar8 = *(uint *)(CONCAT44(extraout_var_01,iVar7) + 8) & 0x7f;
  bVar5 = 1;
  pcVar16 = (char *)0x0;
  switch(uVar8) {
  case 0xf:
    pcVar16 = (char *)0x0;
    bVar5 = (this->super_TParseContextBase).super_TParseVersions.language != EShLangMesh;
    if (!(bool)bVar5) {
      pcVar16 = "can\'t modify variable with storage qualifier taskPayloadSharedEXT in mesh shaders"
      ;
    }
    break;
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x1c:
    break;
  case 0x14:
    pcVar16 = "can\'t modify gl_VertexID";
    goto LAB_0042893a;
  case 0x15:
    pcVar16 = "can\'t modify gl_InstanceID";
    goto LAB_0042893a;
  case 0x19:
    pcVar16 = "can\'t modify gl_FrontFace";
    goto LAB_0042893a;
  case 0x1a:
    pcVar16 = "can\'t modify gl_FragCoord";
    goto LAB_0042893a;
  case 0x1b:
    pcVar16 = "can\'t modify gl_PointCoord";
LAB_0042893a:
    bVar5 = 0;
    break;
  case 0x1d:
    pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    pTVar2->depthReplacing = true;
    if ((this->super_TParseContextBase).super_TParseVersions.profile != EEsProfile)
    goto LAB_0042890a;
    bVar6 = pTVar2->earlyFragmentTests;
    pcVar15 = "can\'t modify gl_FragDepth if using early_fragment_tests";
LAB_004288ff:
    bVar5 = bVar6 ^ 1;
    pcVar16 = (char *)0x0;
    if (bVar6 != 0) {
      pcVar16 = pcVar15;
    }
    break;
  case 0x1e:
    pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    pTVar2->stencilReplacing = true;
    if ((this->super_TParseContextBase).super_TParseVersions.profile == EEsProfile) {
      bVar6 = pTVar2->earlyFragmentTests;
      pcVar15 = "can\'t modify EvqFragStencil if using early_fragment_tests";
      goto LAB_004288ff;
    }
LAB_0042890a:
    pcVar16 = (char *)0x0;
    break;
  default:
    if (uVar8 == 3) {
      pcVar16 = "can\'t modify shader input";
      goto LAB_0042893a;
    }
  }
  if (((plVar9 == (long *)0x0) && (plVar10 == (long *)0x0)) && (bVar5 != 0)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc," l-value required",op,"","");
  }
  else {
    if (bVar5 != 0) {
LAB_00428976:
      bVar5 = 0;
      goto LAB_004289c6;
    }
    if (plVar10 == (long *)0x0) {
      pcVar15 = "(%s)";
    }
    else {
      pcVar15 = "\"%s\" (%s)";
      pcVar16 = local_60;
    }
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc," l-value required",op,pcVar15,pcVar16);
  }
  bVar5 = 1;
LAB_004289c6:
  return (bool)(bVar5 & 1);
}

Assistant:

bool TParseContext::lValueErrorCheck(const TSourceLoc& loc, const char* op, TIntermTyped* node)
{
    TIntermBinary* binaryNode = node->getAsBinaryNode();

    if (binaryNode) {
        bool errorReturn = false;

        switch(binaryNode->getOp()) {
        case EOpIndexDirect:
        case EOpIndexIndirect:
            // ...  tessellation control shader ...
            // If a per-vertex output variable is used as an l-value, it is a
            // compile-time or link-time error if the expression indicating the
            // vertex index is not the identifier gl_InvocationID.
            if (language == EShLangTessControl) {
                const TType& leftType = binaryNode->getLeft()->getType();
                if (leftType.getQualifier().storage == EvqVaryingOut && ! leftType.getQualifier().patch && binaryNode->getLeft()->getAsSymbolNode()) {
                    // we have a per-vertex output
                    const TIntermSymbol* rightSymbol = binaryNode->getRight()->getAsSymbolNode();
                    if (! rightSymbol || rightSymbol->getQualifier().builtIn != EbvInvocationId)
                        error(loc, "tessellation-control per-vertex output l-value must be indexed with gl_InvocationID", "[]", "");
                }
            }
            break; // left node is checked by base class
        case EOpVectorSwizzle:
            errorReturn = lValueErrorCheck(loc, op, binaryNode->getLeft());
            if (!errorReturn) {
                int offset[4] = {0,0,0,0};

                TIntermTyped* rightNode = binaryNode->getRight();
                TIntermAggregate *aggrNode = rightNode->getAsAggregate();

                for (TIntermSequence::iterator p = aggrNode->getSequence().begin();
                                               p != aggrNode->getSequence().end(); p++) {
                    int value = (*p)->getAsTyped()->getAsConstantUnion()->getConstArray()[0].getIConst();
                    offset[value]++;
                    if (offset[value] > 1) {
                        error(loc, " l-value of swizzle cannot have duplicate components", op, "", "");

                        return true;
                    }
                }
            }

            return errorReturn;
        default:
            break;
        }

        if (errorReturn) {
            error(loc, " l-value required", op, "", "");
            return true;
        }
    }

    if (binaryNode && binaryNode->getOp() == EOpIndexDirectStruct && binaryNode->getLeft()->isReference())
        return false;

    // Let the base class check errors
    if (TParseContextBase::lValueErrorCheck(loc, op, node))
        return true;

    const char* symbol = nullptr;
    TIntermSymbol* symNode = node->getAsSymbolNode();
    if (symNode != nullptr)
        symbol = symNode->getName().c_str();

    const char* message = nullptr;
    switch (node->getQualifier().storage) {
    case EvqVaryingIn:      message = "can't modify shader input";   break;
    case EvqInstanceId:     message = "can't modify gl_InstanceID";  break;
    case EvqVertexId:       message = "can't modify gl_VertexID";    break;
    case EvqFace:           message = "can't modify gl_FrontFace";   break;
    case EvqFragCoord:      message = "can't modify gl_FragCoord";   break;
    case EvqPointCoord:     message = "can't modify gl_PointCoord";  break;
    case EvqFragDepth:
        intermediate.setDepthReplacing();
        // "In addition, it is an error to statically write to gl_FragDepth in the fragment shader."
        if (isEsProfile() && intermediate.getEarlyFragmentTests())
            message = "can't modify gl_FragDepth if using early_fragment_tests";
        break;
    case EvqFragStencil:
        intermediate.setStencilReplacing();
        // "In addition, it is an error to statically write to gl_FragDepth in the fragment shader."
        if (isEsProfile() && intermediate.getEarlyFragmentTests())
            message = "can't modify EvqFragStencil if using early_fragment_tests";
        break;

    case EvqtaskPayloadSharedEXT:
        if (language == EShLangMesh)
            message = "can't modify variable with storage qualifier taskPayloadSharedEXT in mesh shaders";
        break;
    default:
        break;
    }

    if (message == nullptr && binaryNode == nullptr && symNode == nullptr) {
        error(loc, " l-value required", op, "", "");

        return true;
    }

    //
    // Everything else is okay, no error.
    //
    if (message == nullptr)
        return false;

    //
    // If we get here, we have an error and a message.
    //
    if (symNode)
        error(loc, " l-value required", op, "\"%s\" (%s)", symbol, message);
    else
        error(loc, " l-value required", op, "(%s)", message);

    return true;
}